

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int tohex(lua_State *L)

{
  int iVar1;
  UB local_30;
  UB local_2c;
  char local_28 [4];
  int i;
  char buf [8];
  char *hexdigits;
  int n;
  UB b;
  lua_State *L_local;
  
  hexdigits._4_4_ = barg(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 == -1) {
    local_30 = 8;
  }
  else {
    local_30 = barg(L,2);
  }
  hexdigits._0_4_ = local_30;
  buf = (char  [8])anon_var_dwarf_1b45;
  if ((int)local_30 < 0) {
    hexdigits._0_4_ = -local_30;
    buf = (char  [8])anon_var_dwarf_1b51;
  }
  if (8 < (int)(UB)hexdigits) {
    hexdigits._0_4_ = 8;
  }
  local_2c = (UB)hexdigits;
  while (local_2c = local_2c - 1, -1 < (int)local_2c) {
    local_28[(int)local_2c] = *(char *)((long)buf + (ulong)(hexdigits._4_4_ & 0xf));
    hexdigits._4_4_ = hexdigits._4_4_ >> 4;
  }
  lua_pushlstring(L,local_28,(long)(int)(UB)hexdigits);
  return 1;
}

Assistant:

static int tohex(lua_State*L){
UB b=barg(L,1);
int n=lua_isnone(L,2)?8:(int)barg(L,2);
const char*hexdigits="0123456789abcdef";
char buf[8];
int i;
if(n<0){n=-n;hexdigits="0123456789ABCDEF";}
if(n>8)n=8;
for(i=(int)n;--i>=0;){buf[i]=hexdigits[b&15];b>>=4;}
lua_pushlstring(L,buf,(size_t)n);
return 1;
}